

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valinvokegen.cpp
# Opt level: O1

bool is_a_object_gen_proc(Am_Object *self)

{
  bool bVar1;
  Am_Value *this;
  Am_Object AStack_18;
  Am_Object local_10;
  
  Am_Object::Get_Object(&local_10,(Am_Slot_Key)self,0x170);
  Am_Object::Get_Sibling(&AStack_18,(Am_Slot_Key)&local_10,(ulong)Am_TYPE_OBJECTS_WIDGET);
  this = Am_Object::Get(&AStack_18,0xfa,0);
  bVar1 = Am_Value::Valid(this);
  Am_Object::~Am_Object(&AStack_18);
  Am_Object::~Am_Object(&local_10);
  return bVar1;
}

Assistant:

Am_Define_Formula(bool, is_a_object_gen)
{
  return self.Get_Object(Am_SAVED_OLD_OWNER)
      .Get_Sibling(Am_TYPE_OBJECTS_WIDGET)
      .Get(Am_VALUES)
      .Valid();
}